

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

void __thiscall
AlignmentRecord::overlapMerge
          (AlignmentRecord *this,string *algn,string *ref,AlignmentRecord *ar,string *dna,
          string *qualities,string *nucigar,int *c_pos1,int *c_pos2,int *q_pos1,int *q_pos2,
          int *ref_pos,int *ref_rel_pos,int i,int j)

{
  byte bVar1;
  pointer pcVar2;
  int *piVar3;
  vector<char,_std::allocator<char>_> *pvVar4;
  ShortDnaSequence *this_00;
  char cVar5;
  byte bVar10;
  ShortDnaSequence *this_01;
  int *local_98;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50[0] = local_40;
  if (i == 1) {
    bVar10 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[*c_pos1];
    pcVar2 = (this->reference_seq1)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + (this->reference_seq1)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    this_00 = &this->sequence1;
  }
  else {
    bVar10 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[*c_pos1];
    pcVar2 = (this->reference_seq2)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + (this->reference_seq2)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    this_00 = &this->sequence2;
  }
  local_98 = c_pos2;
  pvVar4 = &ar->cigar2_unrolled;
  if (j == 1) {
    pvVar4 = &ar->cigar1_unrolled;
  }
  this_01 = &ar->sequence1;
  if (j != 1) {
    this_01 = &ar->sequence2;
  }
  bVar1 = (pvVar4->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_start[*c_pos2];
  cVar5 = (char)ref;
  cVar6 = (char)nucigar;
  cVar7 = (char)algn;
  cVar8 = (char)dna;
  cVar9 = (char)qualities;
  if ((((bVar10 == 0x4d) && (bVar1 == 0x4d)) || ((bVar10 == 0x53 && (bVar1 == 0x53)))) ||
     ((bVar10 == 0x49 && (bVar1 == 0x49)))) {
    if (bVar10 == 0x53) {
LAB_001737f5:
      *ref_rel_pos = *ref_rel_pos + 1;
      *ref_pos = *ref_pos + 1;
    }
    else {
      ShortDnaSequence::operator[](this_00,(long)*q_pos1);
      ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
      ShortDnaSequence::operator[](this_01,(long)*q_pos2);
      ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
      std::__cxx11::string::push_back(cVar8);
      std::__cxx11::string::push_back(cVar7);
      std::__cxx11::string::push_back(cVar9);
      std::__cxx11::string::push_back(cVar6);
      if ((bVar10 != 0x49) && (local_68 <= (ulong)(long)*ref_rel_pos)) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::__cxx11::string::push_back(cVar5);
      if (bVar10 != 0x49) goto LAB_001737f5;
    }
    *q_pos1 = *q_pos1 + 1;
    *q_pos2 = *q_pos2 + 1;
    *c_pos1 = *c_pos1 + 1;
  }
  else {
    local_98 = q_pos1;
    if ((bVar10 == 0x44) && (bVar1 == 0x44)) {
LAB_001736b1:
      *c_pos1 = *c_pos1 + 1;
      *c_pos2 = *c_pos2 + 1;
      if (local_68 <= (ulong)(long)*ref_rel_pos) {
LAB_00173c43:
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::__cxx11::string::push_back(cVar5);
      *ref_rel_pos = *ref_rel_pos + 1;
      *ref_pos = *ref_pos + 1;
      if ((bVar10 == 0x44) || (bVar1 == 0x44)) {
        std::__cxx11::string::push_back(cVar6);
        std::__cxx11::string::push_back(cVar7);
      }
      piVar3 = q_pos2;
      if (bVar10 == 0x53) goto LAB_00173820;
    }
    else {
      if (((bVar10 == 0x48 || bVar10 == 0x44) && bVar1 == 0x48) ||
         (((bVar10 == 0x48 && bVar1 == 0x44 || (bVar10 == 0x44 && bVar1 == 0x53)) ||
          (bVar10 == 0x53 && bVar1 == 0x44)))) goto LAB_001736b1;
      if (((bVar10 != 0x4d) || (0xf < bVar1 - 0x44)) ||
         ((0x8011U >> (bVar1 - 0x44 & 0x1f) & 1) == 0)) {
        if (((((bVar10 == 0x44 || bVar10 == 0x48) || bVar10 == 0x53) && bVar1 == 0x4d) ||
            (bVar10 == 0x53 && bVar1 == 0x48)) || (bVar10 == 0x48 && bVar1 == 0x53))
        goto LAB_00173998;
        if ((bVar10 != 0x49) && (bVar1 != 0x49)) goto LAB_00173826;
        if (bVar10 == 0x49) {
          std::__cxx11::string::push_back(cVar6);
          ShortDnaSequence::operator[](this_00,(long)*q_pos1);
          std::__cxx11::string::push_back(cVar8);
          ShortDnaSequence::operator[](this_00,(long)*q_pos1);
          std::__cxx11::string::push_back(cVar7);
          ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
          std::__cxx11::string::push_back(cVar9);
          std::__cxx11::string::push_back(cVar5);
          *c_pos1 = *c_pos1 + 1;
        }
        else {
          std::__cxx11::string::push_back(cVar6);
          ShortDnaSequence::operator[](this_01,(long)*q_pos2);
          std::__cxx11::string::push_back(cVar8);
          ShortDnaSequence::operator[](this_01,(long)*q_pos2);
          std::__cxx11::string::push_back(cVar7);
          ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
          std::__cxx11::string::push_back(cVar9);
          std::__cxx11::string::push_back(cVar5);
          *c_pos2 = *c_pos2 + 1;
          local_98 = q_pos2;
        }
        goto LAB_00173820;
      }
LAB_00173998:
      if (bVar10 == 0x4d) {
        std::__cxx11::string::push_back(cVar6);
        ShortDnaSequence::operator[](this_00,(long)*q_pos1);
        std::__cxx11::string::push_back(cVar8);
        ShortDnaSequence::operator[](this_00,(long)*q_pos1);
        std::__cxx11::string::push_back(cVar7);
        ShortDnaSequence::qualityChar(this_00,(long)*q_pos1);
        std::__cxx11::string::push_back(cVar9);
        if (local_68 <= (ulong)(long)*ref_rel_pos) goto LAB_00173c43;
        std::__cxx11::string::push_back(cVar5);
        *ref_rel_pos = *ref_rel_pos + 1;
        *ref_pos = *ref_pos + 1;
        *c_pos1 = *c_pos1 + 1;
        *c_pos2 = *c_pos2 + 1;
        *q_pos1 = *q_pos1 + 1;
        piVar3 = q_pos2;
      }
      else {
        if (bVar1 != 0x4d) {
          *ref_rel_pos = *ref_rel_pos + 1;
          *ref_pos = *ref_pos + 1;
          *c_pos1 = *c_pos1 + 1;
          *c_pos2 = *c_pos2 + 1;
          local_98 = q_pos2;
          if (bVar10 == 0x53) {
            local_98 = q_pos1;
          }
          goto LAB_00173820;
        }
        std::__cxx11::string::push_back(cVar6);
        ShortDnaSequence::operator[](this_01,(long)*q_pos2);
        std::__cxx11::string::push_back(cVar8);
        ShortDnaSequence::operator[](this_01,(long)*q_pos2);
        std::__cxx11::string::push_back(cVar7);
        ShortDnaSequence::qualityChar(this_01,(long)*q_pos2);
        std::__cxx11::string::push_back(cVar9);
        if (local_68 <= (ulong)(long)*ref_rel_pos) goto LAB_00173c43;
        std::__cxx11::string::push_back(cVar5);
        *ref_rel_pos = *ref_rel_pos + 1;
        *ref_pos = *ref_pos + 1;
        *c_pos1 = *c_pos1 + 1;
        *c_pos2 = *c_pos2 + 1;
        *q_pos2 = *q_pos2 + 1;
        piVar3 = q_pos1;
        bVar1 = bVar10;
      }
    }
    local_98 = piVar3;
    if (bVar1 != 0x53) goto LAB_00173826;
  }
LAB_00173820:
  *local_98 = *local_98 + 1;
LAB_00173826:
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void AlignmentRecord::overlapMerge(std::string& algn,std::string& ref,const AlignmentRecord& ar, std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos1, int& c_pos2, int& q_pos1, int& q_pos2, int& ref_pos, int& ref_rel_pos, int i, int j) const{
    char c1, c2;
    const ShortDnaSequence* s1,* s2 = 0;
    std::string r = "";
    if (i == 1){
        c1 = this->cigar1_unrolled[c_pos1];
        s1 = &this->sequence1;
        r = this->getReferenceSeq1();
        if(j == 1){
            c2 = ar.getCigar1Unrolled()[c_pos2];
            s2 = &ar.getSequence1();
        } else {
            c2 = ar.getCigar2Unrolled()[c_pos2];
            s2 = &ar.getSequence2();
        }
    } else {
        c1 = this->cigar2_unrolled[c_pos1];

        s1 = &this->sequence2;
        r = this->getReferenceSeq2();
        if(j == 1){
            c2 = ar.getCigar1Unrolled()[c_pos2];
            s2 = &ar.getSequence1();
        } else {
            c2 = ar.getCigar2Unrolled()[c_pos2];
            s2 = &ar.getSequence2();
        }
    }
    if((c1 == 'M' && c2 == 'M') || (c1 == 'S' && c2 == 'S') || (c1 == 'I' && c2 == 'I')){

        if (c1 != 'S'){
            std::pair<char,char> resPair = computeEntry((*s1)[q_pos1],s1->qualityChar(q_pos1),(*s2)[q_pos2],s2->qualityChar(q_pos2));
            dna += resPair.first;
            algn += resPair.first;
            qualities += resPair.second;
            nucigar += c1;
            if(c1=='I'){
                ref+= 'I';
            }else{
                ref+= r.at(ref_rel_pos);
            }
        }
        if (c1 != 'I'){
            ref_rel_pos++;
            ref_pos++;
        }
        q_pos1++;
        q_pos2++;
        c_pos1++;
        c_pos2++;
    } else if ((c1 == 'D' && c2 == 'D') || (c1 == 'H' && c2 == 'H') || (c1 == 'D' && c2 == 'H') || (c1 == 'H' && c2 == 'D') || (c1 == 'D' && c2 == 'S') || (c1 == 'S' && c2 == 'D')){

        c_pos1++;
        c_pos2++;
        ref+= r.at(ref_rel_pos);
        ref_rel_pos++;
        ref_pos++;
        if (c1 == 'D' || c2 == 'D'){
            nucigar += 'D';
            algn +='D';
        }
        if (c1 == 'S'){
            q_pos1++;
        } else if(c2 == 'S'){
            q_pos2++;
        }
    } else if ((c1 == 'M' && (c2 == 'D' || c2 == 'H' || c2 == 'S')) || ((c1 == 'D' || c1 == 'H' || c1 == 'S') && c2 == 'M') || (c1 == 'S' && c2 == 'H') || (c1 == 'H' && c2 == 'S')) {

        if (c1 == 'M'){
            nucigar += 'M';
            dna += (*s1)[q_pos1];
            algn+=(*s1)[q_pos1];
            qualities += s1->qualityChar(q_pos1);
            ref+= r.at(ref_rel_pos);
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
            if (c2 == 'S') q_pos2++;
        } else if (c2 == 'M'){
            nucigar += 'M';
            dna +=  (*s2)[q_pos2];
            algn+= (*s2)[q_pos2];
            qualities += s2->qualityChar(q_pos2);
            ref+= r.at(ref_rel_pos);
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
            if (c1 == 'S') q_pos1++;
        } else if (c1 == 'S'){
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos1++;
        } else {
            ref_rel_pos++;
            ref_pos++;
            c_pos1++;
            c_pos2++;
            q_pos2++;
        }
    } else if (c1 == 'I' || c2 == 'I'){

        if(c1 == 'I'){
            nucigar += 'I';
            dna += (*s1)[q_pos1];
            algn+=(*s1)[q_pos1];
            qualities += s1->qualityChar(q_pos1);
            ref+= 'I';
            c_pos1++;
            q_pos1++;
        } else {
            nucigar += 'I';
            dna +=  (*s2)[q_pos2];
            algn+=(*s2)[q_pos2];
            qualities += s2->qualityChar(q_pos2);
            ref+= 'I';
            c_pos2++;
            q_pos2++;
        }
    } else{
        assert(false);
    }
}